

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

string * __thiscall
cmLocalUnixMakefileGenerator3::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,
          cmGeneratorTarget *target)

{
  string *psVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  size_type local_20;
  pointer local_18;
  
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  local_18 = (psVar1->_M_dataplus)._M_p;
  local_20 = psVar1->_M_string_length;
  local_30._M_len = 0xb;
  local_30._M_str = "CMakeFiles/";
  views._M_len = 2;
  views._M_array = &local_30;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetTargetDirectory(
  cmGeneratorTarget const* target) const
{
  std::string dir = cmStrCat("CMakeFiles/", target->GetName());
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}